

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_test_fixture.cpp
# Opt level: O2

void __thiscall
wallet::InitWalletDirTestingSetup::~InitWalletDirTestingSetup(InitWalletDirTestingSetup *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::filesystem::current_path((path *)&this->m_cwd);
  std::unique_ptr<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>::
  ~unique_ptr(&this->m_wallet_loader);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
  ::~_Rb_tree(&(this->m_walletdir_path_cases)._M_t);
  std::filesystem::__cxx11::path::~path(&(this->m_cwd).super_path);
  std::filesystem::__cxx11::path::~path(&(this->m_datadir).super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    BasicTestingSetup::~BasicTestingSetup(&this->super_BasicTestingSetup);
    return;
  }
  __stack_chk_fail();
}

Assistant:

InitWalletDirTestingSetup::~InitWalletDirTestingSetup()
{
    fs::current_path(m_cwd);
}